

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveTable(Parser *parser,int flags)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  string *str;
  undefined4 in_register_00000034;
  Parser *this;
  path local_c0;
  undefined1 local_a0 [16];
  StringLiteral encodingName;
  undefined1 local_70 [4];
  Encoding encoding;
  StringLiteral fileName;
  undefined1 local_40 [8];
  vector<Expression,_std::allocator<Expression>_> list;
  Token *start;
  int flags_local;
  Parser *parser_local;
  
  this = (Parser *)CONCAT44(in_register_00000034,flags);
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Parser::peekToken(this,0);
  std::vector<Expression,_std::allocator<Expression>_>::vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_40);
  bVar1 = Parser::parseExpressionList
                    (this,(vector<Expression,_std::allocator<Expression>_> *)local_40,1,2);
  if (!bVar1) {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
    fileName._value.field_2._8_4_ = 1;
    goto LAB_00206447;
  }
  StringLiteral::StringLiteral((StringLiteral *)local_70);
  pvVar2 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                     ((vector<Expression,_std::allocator<Expression>_> *)local_40,0);
  bVar1 = Expression::evaluateString(pvVar2,(StringLiteral *)local_70,true);
  if (bVar1) {
    encodingName._value.field_2._12_4_ = 5;
    sVar3 = std::vector<Expression,_std::allocator<Expression>_>::size
                      ((vector<Expression,_std::allocator<Expression>_> *)local_40);
    if (sVar3 == 2) {
      StringLiteral::StringLiteral((StringLiteral *)(local_a0 + 8));
      pvVar2 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                         ((vector<Expression,_std::allocator<Expression>_> *)local_40,1);
      bVar1 = Expression::evaluateString(pvVar2,(StringLiteral *)(local_a0 + 8),true);
      if (bVar1) {
        str = StringLiteral::string_abi_cxx11_((StringLiteral *)(local_a0 + 8));
        encodingName._value.field_2._12_4_ = getEncodingFromString(str);
      }
      else {
        Parser::printError<>
                  (this,(Token *)list.super__Vector_base<Expression,_std::allocator<Expression>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                   "Invalid encoding name");
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<std::default_delete<CAssemblerCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   (nullptr_t)0x0);
      }
      fileName._value.field_2._9_3_ = 0;
      fileName._value.field_2._M_local_buf[8] = !bVar1;
      StringLiteral::~StringLiteral((StringLiteral *)(local_a0 + 8));
      if (fileName._value.field_2._8_4_ != 0) goto LAB_00206431;
    }
    StringLiteral::path(&local_c0,(StringLiteral *)local_70);
    std::make_unique<TableCommand,ghc::filesystem::path,TextFile::Encoding&>
              ((path *)local_a0,(Encoding *)&local_c0);
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<TableCommand,std::default_delete<TableCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (unique_ptr<TableCommand,_std::default_delete<TableCommand>_> *)local_a0);
    std::unique_ptr<TableCommand,_std::default_delete<TableCommand>_>::~unique_ptr
              ((unique_ptr<TableCommand,_std::default_delete<TableCommand>_> *)local_a0);
    ghc::filesystem::path::~path(&local_c0);
    fileName._value.field_2._8_4_ = 1;
  }
  else {
    Parser::printError<>
              (this,(Token *)list.super__Vector_base<Expression,_std::allocator<Expression>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,"Invalid file name");
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
    fileName._value.field_2._8_4_ = 1;
  }
LAB_00206431:
  StringLiteral::~StringLiteral((StringLiteral *)local_70);
LAB_00206447:
  std::vector<Expression,_std::allocator<Expression>_>::~vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_40);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveTable(Parser& parser, int flags)
{
	const Token& start = parser.peekToken();

	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral fileName;
	if (!list[0].evaluateString(fileName,true))
	{
		parser.printError(start, "Invalid file name");
		return nullptr;
	}

	TextFile::Encoding encoding = TextFile::GUESS;
	if (list.size() == 2)
	{
		StringLiteral encodingName;
		if (!list[1].evaluateString(encodingName,true))
		{
			parser.printError(start, "Invalid encoding name");
			return nullptr;
		}

		encoding = getEncodingFromString(encodingName.string());
	}

	return std::make_unique<TableCommand>(fileName.path(),encoding);
}